

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_moves_8_ix(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint ea;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
  }
  else if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
  }
  else {
    uVar2 = m68ki_read_imm_16();
    uVar3 = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
    if ((uVar2 & 0x800) == 0) {
      if ((uVar2 & 0x8000) == 0) {
        uVar1 = m68ki_cpu.dar[uVar2 >> 0xc & 7];
        uVar3 = m68ki_read_8_fc(uVar3,m68ki_cpu.sfc);
        m68ki_cpu.dar[uVar2 >> 0xc & 7] = uVar1 & 0xffffff00 | uVar3;
        if ((m68ki_cpu.cpu_type & 0x18) != 0) {
          m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
        }
      }
      else {
        uVar3 = m68ki_read_8_fc(uVar3,m68ki_cpu.sfc);
        m68ki_cpu.dar[(ulong)(uVar2 >> 0xc & 7) + 8] = (int)(char)uVar3;
        if ((m68ki_cpu.cpu_type & 0x18) != 0) {
          m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
        }
      }
    }
    else {
      m68ki_write_8_fc(uVar3,m68ki_cpu.dfc,m68ki_cpu.dar[uVar2 >> 0xc & 0xf] & 0xff);
    }
  }
  return;
}

Assistant:

static void m68k_op_moves_8_ix(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AY_IX_8();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_8_fc(ea, REG_DFC, MASK_OUT_ABOVE_8(REG_DA[(word2 >> 12) & 15]));
				return;
			}
			if(BIT_F(word2))		   /* Memory to address register */
			{
				REG_A[(word2 >> 12) & 7] = MAKE_INT_8(m68ki_read_8_fc(ea, REG_SFC));
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to data register */
			REG_D[(word2 >> 12) & 7] = MASK_OUT_BELOW_8(REG_D[(word2 >> 12) & 7]) | m68ki_read_8_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}